

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::~SupportVectorRegressor(SupportVectorRegressor *this)

{
  SupportVectorRegressor *this_local;
  
  ~SupportVectorRegressor(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

SupportVectorRegressor::~SupportVectorRegressor() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.SupportVectorRegressor)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}